

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::updateScene(QGraphicsView *this,QList<QRectF> *rects)

{
  bool bVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  QGraphicsViewPrivate *pQVar5;
  QWidget *this_00;
  long lVar6;
  qsizetype qVar7;
  ulong uVar8;
  const_iterator o;
  QRect *pQVar9;
  QList<QRectF> *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect *rect_1;
  add_const_t<QList<QRect>_> *__range1_2;
  QRectF *rect;
  QList<QRectF> *__range1_1;
  bool redraw;
  bool boundingRectUpdate;
  bool fullUpdate;
  QRect *dirtyRect;
  const_iterator __end1;
  const_iterator __begin1;
  QRegion *__range1;
  QGraphicsViewPrivate *d;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  QRect xrect;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QRect viewportRect;
  QRect boundingRect;
  QRegion updateRegion;
  QList<QRect> dirtyViewportRects;
  QTransform transform;
  undefined4 in_stack_fffffffffffffe58;
  OptimizationFlag in_stack_fffffffffffffe5c;
  QRect *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe6d;
  bool bVar10;
  undefined1 uVar11;
  bool bVar12;
  undefined1 uVar13;
  QList<QRect> *in_stack_fffffffffffffe88;
  long local_140;
  qsizetype in_stack_fffffffffffffec8;
  const_iterator local_108;
  QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4> local_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [16];
  QRectF *local_c8;
  const_iterator local_c0;
  const_iterator local_b8;
  undefined1 local_b0 [16];
  undefined1 *local_a0;
  undefined1 *local_98;
  QRegion local_90;
  undefined8 local_88;
  undefined8 local_80;
  QRegion local_78;
  QList<QRect> local_70;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QGraphicsView *)0xa3b7ee);
  auVar2._8_8_ = local_d8._8_8_;
  auVar2._0_8_ = local_d8._0_8_;
  if (((*(uint *)&pQVar5->field_0x300 >> 0xc & 1) == 0) &&
     (local_d8 = auVar2, pQVar5->viewportUpdateMode != NoViewportUpdate)) {
    local_70.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_70.d.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
    local_70.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QRect>::QList((QList<QRect> *)0xa3b856);
    iVar4 = QRegion::rectCount();
    this_00 = (QWidget *)(long)iVar4;
    QList<QRectF>::size(in_RSI);
    QList<QRect>::reserve(in_stack_fffffffffffffe88,in_stack_fffffffffffffec8);
    local_140 = QRegion::begin();
    lVar6 = QRegion::end();
    for (; local_140 != lVar6; local_140 = local_140 + 0x10) {
      QList<QRect>::operator+=
                ((QList<QRect> *)in_stack_fffffffffffffe60,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    QRegion::QRegion(&local_78);
    QRegion::operator=((QRegion *)in_stack_fffffffffffffe60,
                       (QRegion *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QRegion::~QRegion(&local_78);
    QRect::QRect(in_stack_fffffffffffffe60);
    (pQVar5->dirtyBoundingRect).x1 = (Representation)(undefined4)local_88;
    (pQVar5->dirtyBoundingRect).y1 = (Representation)local_88._4_4_;
    (pQVar5->dirtyBoundingRect).x2 = (Representation)(undefined4)local_80;
    (pQVar5->dirtyBoundingRect).y2 = (Representation)local_80._4_4_;
    bVar12 = true;
    if ((*(uint *)&pQVar5->field_0x300 >> 6 & 1) != 0) {
      bVar12 = pQVar5->viewportUpdateMode == FullViewportUpdate;
    }
    bVar10 = true;
    uVar13 = bVar12;
    if ((pQVar5->viewportUpdateMode != BoundingRectViewportUpdate) &&
       (in_stack_fffffffffffffe6d = false, bVar10 = (bool)in_stack_fffffffffffffe6d,
       pQVar5->viewportUpdateMode == SmartViewportUpdate)) {
      in_stack_fffffffffffffe60 = (QRect *)QList<QRect>::size(&local_70);
      qVar7 = QList<QRectF>::size(in_RSI);
      in_stack_fffffffffffffe6d = 0x31 < (long)&(in_stack_fffffffffffffe60->x1).m_i + qVar7;
      bVar10 = (bool)in_stack_fffffffffffffe6d;
    }
    local_90.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    uVar11 = bVar10;
    QRegion::QRegion(&local_90);
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    QRect::QRect(in_stack_fffffffffffffe60);
    local_b0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffe60);
    local_b0 = (undefined1  [16])QWidget::rect(in_RDI);
    bVar1 = false;
    memcpy(local_58,&DAT_00b48138,0x50);
    viewportTransform((QGraphicsView *)in_RDI);
    local_b8.i = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = QList<QRectF>::begin((QList<QRectF> *)in_stack_fffffffffffffe60);
    local_c0.i = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
    local_c0 = QList<QRectF>::end((QList<QRectF> *)in_stack_fffffffffffffe60);
    while( true ) {
      local_c8 = local_c0.i;
      bVar3 = QList<QRectF>::const_iterator::operator!=(&local_b8,local_c0);
      if (!bVar3) break;
      QList<QRectF>::const_iterator::operator*(&local_b8);
      local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTransform::mapRect((QRectF *)local_f8);
      local_d8 = QRectF::toAlignedRect();
      local_fc.super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i =
           (QFlagsStorage<QGraphicsView::OptimizationFlag>)
           QFlags<QGraphicsView::OptimizationFlag>::operator&
                     ((QFlags<QGraphicsView::OptimizationFlag> *)in_stack_fffffffffffffe60,
                      in_stack_fffffffffffffe5c);
      bVar3 = QFlags<QGraphicsView::OptimizationFlag>::operator!
                        ((QFlags<QGraphicsView::OptimizationFlag> *)&local_fc);
      iVar4 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
      if (bVar3) {
        QRect::adjust((QRect *)this_00,
                      CONCAT13(uVar13,CONCAT12(uVar11,CONCAT11(in_stack_fffffffffffffe6d,
                                                               in_stack_fffffffffffffe6c))),
                      in_stack_fffffffffffffe68,iVar4,(int)in_stack_fffffffffffffe60);
      }
      else {
        QRect::adjust((QRect *)this_00,
                      CONCAT13(uVar13,CONCAT12(uVar11,CONCAT11(in_stack_fffffffffffffe6d,
                                                               in_stack_fffffffffffffe6c))),
                      in_stack_fffffffffffffe68,iVar4,(int)in_stack_fffffffffffffe60);
      }
      uVar8 = QRect::intersects((QRect *)local_b0);
      if ((uVar8 & 1) != 0) {
        QList<QRect>::operator<<
                  ((QList<QRect> *)in_stack_fffffffffffffe60,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      QList<QRectF>::const_iterator::operator++(&local_b8);
    }
    local_108.i = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
    local_108 = QList<QRect>::begin(in_stack_fffffffffffffe60);
    o = QList<QRect>::end(in_stack_fffffffffffffe60);
    while( true ) {
      bVar3 = QList<QRect>::const_iterator::operator!=(&local_108,o);
      if (!bVar3) break;
      pQVar9 = QList<QRect>::const_iterator::operator*(&local_108);
      if (bVar10 == false) {
        QRegion::operator+=(&local_90,(QRect *)pQVar9);
      }
      else {
        QRect::operator|=((QRect *)CONCAT17(uVar13,CONCAT16(uVar11,CONCAT15(
                                                  in_stack_fffffffffffffe6d,
                                                  CONCAT14(in_stack_fffffffffffffe6c,
                                                           in_stack_fffffffffffffe68)))),
                          in_stack_fffffffffffffe60);
      }
      bVar1 = true;
      if (bVar12 != false) break;
      QList<QRect>::const_iterator::operator++(&local_108);
    }
    if (bVar1) {
      if (bVar12 == false) {
        if (bVar10 == false) {
          QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffe60);
          QWidget::update(this_00,(QRegion *)
                                  CONCAT17(uVar13,CONCAT16(uVar11,CONCAT15(in_stack_fffffffffffffe6d
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68)))));
        }
        else {
          QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffe60);
          QWidget::update((QWidget *)
                          CONCAT17(uVar13,CONCAT16(uVar11,CONCAT15(in_stack_fffffffffffffe6d,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68)))),
                          in_stack_fffffffffffffe60);
        }
      }
      else {
        QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffe60);
        QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
    }
    QRegion::~QRegion(&local_90);
    QList<QRect>::~QList((QList<QRect> *)0xa3be0c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::updateScene(const QList<QRectF> &rects)
{
    // ### Note: Since 4.5, this slot is only called if the user explicitly
    // establishes a connection between the scene and the view, as the scene
    // and view are no longer connected. We need to keep it working (basically
    // leave it as it is), but the new delivery path is through
    // QGraphicsScenePrivate::itemUpdate().
    Q_D(QGraphicsView);
    if (d->fullUpdatePending || d->viewportUpdateMode == QGraphicsView::NoViewportUpdate)
        return;

    // Extract and reset dirty scene rect info.
    QList<QRect> dirtyViewportRects;
    dirtyViewportRects.reserve(d->dirtyRegion.rectCount() + rects.size());
    for (const QRect &dirtyRect : d->dirtyRegion)
        dirtyViewportRects += dirtyRect;
    d->dirtyRegion = QRegion();
    d->dirtyBoundingRect = QRect();

    bool fullUpdate = !d->accelerateScrolling || d->viewportUpdateMode == QGraphicsView::FullViewportUpdate;
    bool boundingRectUpdate = (d->viewportUpdateMode == QGraphicsView::BoundingRectViewportUpdate)
                              || (d->viewportUpdateMode == QGraphicsView::SmartViewportUpdate
                                  && ((dirtyViewportRects.size() + rects.size()) >= QGRAPHICSVIEW_REGION_RECT_THRESHOLD));

    QRegion updateRegion;
    QRect boundingRect;
    QRect viewportRect = viewport()->rect();
    bool redraw = false;
    QTransform transform = viewportTransform();

    // Convert scene rects to viewport rects.
    for (const QRectF &rect : rects) {
        QRect xrect = transform.mapRect(rect).toAlignedRect();
        if (!(d->optimizationFlags & DontAdjustForAntialiasing))
            xrect.adjust(-2, -2, 2, 2);
        else
            xrect.adjust(-1, -1, 1, 1);
        if (!viewportRect.intersects(xrect))
            continue;
        dirtyViewportRects << xrect;
    }

    for (const QRect &rect : std::as_const(dirtyViewportRects)) {
        // Add the exposed rect to the update region. In rect update
        // mode, we only count the bounding rect of items.
        if (!boundingRectUpdate) {
            updateRegion += rect;
        } else {
            boundingRect |= rect;
        }
        redraw = true;
        if (fullUpdate) {
            // If fullUpdate is true and we found a visible dirty rect,
            // we're done.
            break;
        }
    }

    if (!redraw)
        return;

    if (fullUpdate)
        viewport()->update();
    else if (boundingRectUpdate)
        viewport()->update(boundingRect);
    else
        viewport()->update(updateRegion);
}